

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConfigData::ConfigData(ConfigData *this)

{
  ConfigData *this_local;
  
  this->listTests = false;
  this->listTags = false;
  this->listReporters = false;
  this->listTestNamesOnly = false;
  this->showSuccessfulTests = false;
  this->shouldDebugBreak = false;
  this->noThrow = false;
  this->showHelp = false;
  this->showInvisibles = false;
  this->filenamesAsTags = false;
  this->abortAfter = -1;
  this->rngSeed = 0;
  this->verbosity = Normal;
  this->warnings = Nothing;
  this->showDurations = DefaultForReporter;
  this->runOrder = InDeclarationOrder;
  this->useColour = Auto;
  std::__cxx11::string::string((string *)&this->outputFilename);
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->processName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->reporterNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->testsOrTags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->sectionsToRun);
  return;
}

Assistant:

ConfigData()
        :   listTests( false ),
            listTags( false ),
            listReporters( false ),
            listTestNamesOnly( false ),
            showSuccessfulTests( false ),
            shouldDebugBreak( false ),
            noThrow( false ),
            showHelp( false ),
            showInvisibles( false ),
            filenamesAsTags( false ),
            abortAfter( -1 ),
            rngSeed( 0 ),
            verbosity( Verbosity::Normal ),
            warnings( WarnAbout::Nothing ),
            showDurations( ShowDurations::DefaultForReporter ),
            runOrder( RunTests::InDeclarationOrder ),
            useColour( UseColour::Auto )
        {}